

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cc
# Opt level: O0

void __thiscall dnet::nn::relu::relu(relu *this,axes_type *input_shape)

{
  uint __val;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  axes_type *local_18;
  axes_type *input_shape_local;
  relu *this_local;
  
  local_18 = input_shape;
  input_shape_local = (axes_type *)this;
  activation::activation(&this->super_activation,input_shape);
  (this->super_activation).super_op._vptr_op = (_func_int **)&PTR_forwardp_001927a8;
  data_types::matrix::matrix(&this->_prev_x,local_18);
  *(undefined8 *)(this->super_activation).super_op.input_shape._M_elems =
       *(undefined8 *)local_18->_M_elems;
  *(undefined8 *)(this->super_activation).super_op.output_shape._M_elems =
       *(undefined8 *)local_18->_M_elems;
  __val = misc::rand_int(100000);
  std::__cxx11::to_string(&local_68,__val);
  std::operator+(&local_48,"ReLU_",&local_68);
  std::__cxx11::string::operator=
            ((string *)&(this->super_activation).super_op.id,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

relu::relu(const tensor<double, 2>::axes_type &input_shape)
            : _prev_x(input_shape), activation(input_shape)
        {
            this->input_shape = input_shape;
            this->output_shape = input_shape;
            this->id = "ReLU_" + std::to_string(dnet::misc::rand_int(100000));
        }